

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_sse42_intr.c
# Opt level: O3

void ihevc_itrans_recon_4x4_sse42
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  WORD16 *pWVar1;
  long lVar2;
  long lVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  int iVar16;
  int iVar18;
  undefined1 in_XMM2 [16];
  undefined1 auVar13 [16];
  undefined4 uVar17;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar20;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 in_XMM3 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar35;
  int iVar36;
  int iVar40;
  int iVar41;
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  int iVar42;
  undefined1 auVar38 [16];
  undefined4 uVar43;
  undefined1 auVar39 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  int iVar50;
  int iVar51;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar52 [16];
  int iVar58;
  undefined1 auVar59 [16];
  undefined4 uVar34;
  undefined1 auVar47 [16];
  undefined4 uVar49;
  
  auVar13 = pmovsxwd(in_XMM2,*(undefined8 *)pi2_src);
  pWVar1 = pi2_src + src_strd;
  auVar37 = pmovsxwd(in_XMM4,*(undefined8 *)pWVar1);
  auVar44 = pmovsxwd(in_XMM5,*(undefined8 *)(pWVar1 + src_strd));
  lVar2 = (long)dst_strd;
  auVar21 = pmovsxwd(in_XMM3,*(undefined8 *)(pWVar1 + src_strd + src_strd));
  iVar12 = auVar13._0_4_ * 0x40;
  iVar16 = auVar13._4_4_ * 0x40;
  iVar18 = auVar13._8_4_ * 0x40;
  iVar19 = auVar13._12_4_ * 0x40;
  auVar13 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype0[0],auVar37);
  auVar59 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype0[2],auVar21);
  iVar50 = auVar13._0_4_ - auVar59._0_4_;
  iVar53 = auVar13._4_4_ - auVar59._4_4_;
  iVar55 = auVar13._8_4_ - auVar59._8_4_;
  iVar57 = auVar13._12_4_ - auVar59._12_4_;
  auVar37 = pmulld(auVar37,(undefined1  [16])g_ai4_ihevc_trans_4_ttype0[2]);
  auVar13 = pmulld(auVar21,(undefined1  [16])g_ai4_ihevc_trans_4_ttype0[0]);
  auVar22._0_4_ = auVar13._0_4_ + auVar37._0_4_;
  auVar22._4_4_ = auVar13._4_4_ + auVar37._4_4_;
  auVar22._8_4_ = auVar13._8_4_ + auVar37._8_4_;
  auVar22._12_4_ = auVar13._12_4_ + auVar37._12_4_;
  auVar13 = pmovsxbd(auVar59,0x40404040);
  iVar36 = iVar12 + auVar44._0_4_ * -0x40 + auVar13._0_4_;
  iVar40 = iVar16 + auVar44._4_4_ * -0x40 + auVar13._4_4_;
  iVar41 = iVar18 + auVar44._8_4_ * -0x40 + auVar13._8_4_;
  iVar42 = iVar19 + auVar44._12_4_ * -0x40 + auVar13._12_4_;
  iVar12 = iVar12 + auVar13._0_4_ + auVar44._0_4_ * 0x40;
  iVar16 = iVar16 + auVar13._4_4_ + auVar44._4_4_ * 0x40;
  iVar18 = iVar18 + auVar13._8_4_ + auVar44._8_4_ * 0x40;
  iVar19 = iVar19 + auVar13._12_4_ + auVar44._12_4_ * 0x40;
  auVar45._0_4_ = iVar50 + iVar36 >> 7;
  auVar45._4_4_ = iVar53 + iVar40 >> 7;
  auVar45._8_4_ = iVar55 + iVar41 >> 7;
  auVar45._12_4_ = iVar57 + iVar42 >> 7;
  auVar52._0_4_ = auVar22._0_4_ + iVar12 >> 7;
  auVar52._4_4_ = auVar22._4_4_ + iVar16 >> 7;
  auVar52._8_4_ = auVar22._8_4_ + iVar18 >> 7;
  auVar52._12_4_ = auVar22._12_4_ + iVar19 >> 7;
  auVar13 = packssdw(auVar52,auVar45);
  auVar38._0_4_ = iVar36 - iVar50 >> 7;
  auVar38._4_4_ = iVar40 - iVar53 >> 7;
  auVar38._8_4_ = iVar41 - iVar55 >> 7;
  auVar38._12_4_ = iVar42 - iVar57 >> 7;
  auVar15._0_4_ = iVar12 - auVar22._0_4_ >> 7;
  auVar15._4_4_ = iVar16 - auVar22._4_4_ >> 7;
  auVar15._8_4_ = iVar18 - auVar22._8_4_ >> 7;
  auVar15._12_4_ = iVar19 - auVar22._12_4_ >> 7;
  auVar21 = packssdw(auVar38,auVar15);
  auVar26._4_4_ = auVar13._8_4_;
  auVar26._0_4_ = auVar13._0_4_;
  auVar26._8_4_ = auVar13._4_4_;
  auVar26._12_4_ = auVar13._12_4_;
  auVar13 = pshufhw(auVar22,auVar26,0xd8);
  auVar37 = pshuflw(auVar45,auVar26,0xd8);
  auVar27._4_4_ = auVar21._8_4_;
  auVar27._0_4_ = auVar21._0_4_;
  auVar27._8_4_ = auVar21._4_4_;
  auVar27._12_4_ = auVar21._12_4_;
  auVar21 = pshufhw(auVar21,auVar27,0xd8);
  auVar23._4_4_ = auVar21._8_4_;
  auVar23._0_4_ = auVar13._8_4_;
  uVar34 = auVar13._12_4_;
  auVar23._8_4_ = uVar34;
  uVar43 = auVar21._12_4_;
  auVar23._12_4_ = uVar43;
  auVar13 = pshuflw(auVar27,auVar27,0xd8);
  uVar17 = auVar13._4_4_;
  uVar49 = auVar37._4_4_;
  auVar47._0_8_ = auVar37._0_8_;
  auVar47._8_4_ = uVar49;
  auVar47._12_4_ = uVar17;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._0_4_ = auVar37._0_4_;
  auVar46._4_4_ = auVar13._0_4_;
  auVar44 = pmovsxwd(auVar21,auVar46);
  auVar21 = pmovsxwd(auVar13,auVar23);
  auVar48._4_4_ = uVar17;
  auVar48._0_4_ = uVar49;
  auVar48._8_4_ = uVar49;
  auVar48._12_4_ = uVar17;
  auVar13 = pmovsxwd(auVar48,auVar48);
  auVar24._4_4_ = uVar43;
  auVar24._0_4_ = uVar34;
  auVar24._8_4_ = uVar34;
  auVar24._12_4_ = uVar43;
  auVar37 = pmovsxwd(auVar24,auVar24);
  iVar50 = auVar44._0_4_ * 0x40;
  iVar53 = auVar44._4_4_ * 0x40;
  iVar55 = auVar44._8_4_ * 0x40;
  iVar57 = auVar44._12_4_ * 0x40;
  auVar59 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype0[0],auVar13);
  auVar44 = pmulld(auVar13,(undefined1  [16])g_ai4_ihevc_trans_4_ttype0[2]);
  auVar13 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype0[2],auVar37);
  iVar51 = auVar59._0_4_ - auVar13._0_4_;
  iVar54 = auVar59._4_4_ - auVar13._4_4_;
  iVar56 = auVar59._8_4_ - auVar13._8_4_;
  iVar58 = auVar59._12_4_ - auVar13._12_4_;
  auVar13 = pmulld((undefined1  [16])g_ai4_ihevc_trans_4_ttype0[0],auVar37);
  iVar12 = auVar13._0_4_ + auVar44._0_4_;
  iVar16 = auVar13._4_4_ + auVar44._4_4_;
  iVar18 = auVar13._8_4_ + auVar44._8_4_;
  iVar19 = auVar13._12_4_ + auVar44._12_4_;
  auVar13 = pmovsxwd(auVar37,0x800080008000800);
  iVar36 = iVar50 + auVar21._0_4_ * -0x40 + auVar13._0_4_;
  iVar40 = iVar53 + auVar21._4_4_ * -0x40 + auVar13._4_4_;
  iVar41 = iVar55 + auVar21._8_4_ * -0x40 + auVar13._8_4_;
  iVar42 = iVar57 + auVar21._12_4_ * -0x40 + auVar13._12_4_;
  iVar50 = auVar21._0_4_ * 0x40 + iVar50 + auVar13._0_4_;
  iVar53 = auVar21._4_4_ * 0x40 + iVar53 + auVar13._4_4_;
  iVar55 = auVar21._8_4_ * 0x40 + iVar55 + auVar13._8_4_;
  iVar57 = auVar21._12_4_ * 0x40 + iVar57 + auVar13._12_4_;
  auVar25._0_4_ = iVar51 + iVar36 >> 0xc;
  auVar25._4_4_ = iVar54 + iVar40 >> 0xc;
  auVar25._8_4_ = iVar56 + iVar41 >> 0xc;
  auVar25._12_4_ = iVar58 + iVar42 >> 0xc;
  auVar44._0_4_ = iVar36 - iVar51 >> 0xc;
  auVar44._4_4_ = iVar40 - iVar54 >> 0xc;
  auVar44._8_4_ = iVar41 - iVar56 >> 0xc;
  auVar44._12_4_ = iVar42 - iVar58 >> 0xc;
  auVar39._0_4_ = iVar12 + iVar50 >> 0xc;
  auVar39._4_4_ = iVar16 + iVar53 >> 0xc;
  auVar39._8_4_ = iVar18 + iVar55 >> 0xc;
  auVar39._12_4_ = iVar19 + iVar57 >> 0xc;
  auVar37 = packssdw(auVar39,auVar25);
  auVar14._0_4_ = iVar50 - iVar12 >> 0xc;
  auVar14._4_4_ = iVar53 - iVar16 >> 0xc;
  auVar14._8_4_ = iVar55 - iVar18 >> 0xc;
  auVar14._12_4_ = iVar57 - iVar19 >> 0xc;
  auVar21 = packssdw(auVar44,auVar14);
  auVar13._4_4_ = auVar37._8_4_;
  auVar13._0_4_ = auVar37._0_4_;
  auVar13._8_4_ = auVar37._4_4_;
  auVar13._12_4_ = auVar37._12_4_;
  auVar15 = pshufhw(auVar14,auVar13,0xd8);
  auVar13 = pshuflw(auVar13,auVar13,0xd8);
  auVar59._0_4_ = auVar21._0_4_;
  auVar59._12_4_ = auVar21._12_4_;
  auVar59._4_4_ = auVar21._8_4_;
  auVar59._8_4_ = auVar21._4_4_;
  auVar26 = pshufhw(auVar25,auVar59,0xd8);
  auVar44 = pshuflw(auVar59,auVar59,0xd8);
  auVar27 = pmovzxbw(auVar26,*(undefined8 *)pu1_pred);
  auVar37._0_8_ = auVar13._0_8_;
  auVar37._8_4_ = auVar13._4_4_;
  auVar37._12_4_ = auVar44._4_4_;
  auVar21._8_8_ = auVar37._8_8_;
  auVar21._0_4_ = auVar13._0_4_;
  auVar21._4_4_ = auVar44._0_4_;
  lVar3 = (long)pred_strd;
  auVar37 = pmovzxbw(auVar44,*(undefined8 *)(pu1_pred + lVar3));
  auVar59 = pmovzxbw(auVar37,*(undefined8 *)(pu1_pred + lVar3 * 2));
  sVar20 = auVar27._0_2_ + auVar13._0_2_;
  sVar28 = auVar27._2_2_ + auVar13._2_2_;
  sVar29 = auVar27._4_2_ + auVar44._0_2_;
  sVar30 = auVar27._6_2_ + auVar44._2_2_;
  sVar31 = auVar37._0_2_ + auVar13._4_2_;
  sVar32 = auVar37._2_2_ + auVar13._6_2_;
  sVar33 = auVar37._4_2_ + auVar44._4_2_;
  sVar35 = auVar37._6_2_ + auVar44._6_2_;
  auVar13 = pmovzxbw(auVar21,*(undefined8 *)(pu1_pred + lVar3 * 3));
  sVar4 = auVar59._0_2_ + auVar15._8_2_;
  sVar5 = auVar59._2_2_ + auVar15._10_2_;
  sVar6 = auVar59._4_2_ + auVar26._8_2_;
  sVar7 = auVar59._6_2_ + auVar26._10_2_;
  sVar8 = auVar13._0_2_ + auVar15._12_2_;
  sVar9 = auVar13._2_2_ + auVar15._14_2_;
  sVar10 = auVar13._4_2_ + auVar26._12_2_;
  sVar11 = auVar13._6_2_ + auVar26._14_2_;
  *pu1_dst = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
  pu1_dst[1] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
  pu1_dst[2] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
  pu1_dst[3] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
  pu1_dst[lVar2 + 4] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
  pu1_dst[lVar2 + 5] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
  pu1_dst[lVar2 + 6] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
  pu1_dst[lVar2 + 7] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
  lVar3 = lVar2 * 2;
  pu1_dst[lVar3 + 8] = (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4);
  pu1_dst[lVar3 + 9] = (0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 - (0xff < sVar5);
  pu1_dst[lVar3 + 10] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
  pu1_dst[lVar3 + 0xb] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
  lVar2 = lVar2 * 3;
  pu1_dst[lVar2 + 0xc] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
  pu1_dst[lVar2 + 0xd] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
  pu1_dst[lVar2 + 0xe] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
  pu1_dst[lVar2 + 0xf] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_sse42(WORD16 *pi2_src,
                                  WORD16 *pi2_tmp,
                                  UWORD8 *pu1_pred,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 pred_strd,
                                  WORD32 dst_strd,
                                  WORD32 zero_cols,
                                  WORD32 zero_rows)
{


    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_coeff1, m_coeff3;
    __m128i m_rdng_factor;
    __m128i m_count;


    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_rows);
    UNUSED(zero_cols);
    UNUSED(pi2_tmp);


    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);


    m_coeff1 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype0[0][0]); //36
    m_coeff3 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype0[2][0]); //83

    /* e */
    {
        m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 6);
        m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 6);
    }

    /* o */
    {
        m_temp_reg_12 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1); //src[1]*36
        m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_3, m_coeff3); //src[3]*83
        m_temp_reg_14 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3); //src[1]*83
        m_temp_reg_15 = _mm_mullo_epi32(m_temp_reg_3, m_coeff1); //src[3]*36
    }

    m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

    /* e1 stored in m_temp_reg_31 */
    {
        m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_11);
    }

    m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

    /* e0 stored in m_temp_reg_30 */
    {
        m_temp_reg_30 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
    }

    m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
    m_count = _mm_cvtsi32_si128(i4_shift);

    /* o1 stored in m_temp_reg_33 */
    {
        m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_12, m_temp_reg_13);
    }

    /* e1 + add */
    {
        m_temp_reg_31 = _mm_add_epi32(m_temp_reg_31, m_rdng_factor);
    }

    /* e0 + add */
    {
        m_temp_reg_30 = _mm_add_epi32(m_temp_reg_30, m_rdng_factor);
    }

    /* o0 stored in m_temp_reg_34 */
    {
        m_temp_reg_34 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_15);
    }

    /* Stage 1 outputs */
    {
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_31, m_temp_reg_33);
        m_temp_reg_22 = _mm_sub_epi32(m_temp_reg_31, m_temp_reg_33);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_34);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_30, m_temp_reg_34);


        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);

        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);

        /* e */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_20, 6);
        }

        /* o */
        {
            m_temp_reg_12 = _mm_mullo_epi32(m_temp_reg_22, m_coeff1); //src[1]*36
            m_temp_reg_14 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3); //src[1]*83
            m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_23, m_coeff3); //src[3]*83
            m_temp_reg_15 = _mm_mullo_epi32(m_temp_reg_23, m_coeff1); //src[3]*36
        }

        /* e */
        {
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_21, 6);
        }

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        /* e1 stored in m_temp_reg_31 */
        {
            m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_11);
        }

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        /* e0 stored in m_temp_reg_30 */
        {
            m_temp_reg_30 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
        }

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        /* o1 stored in m_temp_reg_33 */
        {
            m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_12, m_temp_reg_13);
        }

        /* e1 + add */
        {
            m_temp_reg_31 = _mm_add_epi32(m_temp_reg_31, m_rdng_factor);
        }

        /* e0 + add */
        {
            m_temp_reg_30 = _mm_add_epi32(m_temp_reg_30, m_rdng_factor);
        }

        /* o0 stored in m_temp_reg_34 */
        {
            m_temp_reg_34 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_15);
        }

        /* Stage 2 outputs */
        {
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_31, m_temp_reg_33);
            m_temp_reg_22 = _mm_sub_epi32(m_temp_reg_31, m_temp_reg_33);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_34);
            m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_30, m_temp_reg_34);

            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);
            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            UWORD32 *pu4_dst = (UWORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}